

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O3

int ffdrwsll(fitsfile *fptr,LONGLONG *rownum,LONGLONG nrows,int *status)

{
  void *buffer;
  int iVar1;
  FITSfile *pFVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  long bytepos;
  long bytepos_00;
  LONGLONG naxis1;
  LONGLONG naxis2;
  char comm [73];
  size_t local_b0;
  void *local_a8;
  long local_a0;
  long local_98;
  LONGLONG local_90;
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  pFVar2 = fptr->Fptr;
  if (fptr->HDUposition != pFVar2->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar2 = fptr->Fptr;
  }
  if (pFVar2->datastart == -1) {
    iVar1 = ffrdef(fptr,status);
    if (0 < iVar1) goto LAB_00113ed6;
    pFVar2 = fptr->Fptr;
  }
  if (pFVar2->hdutype == 0) {
    ffpmsg("Can only delete rows in TABLE or BINTABLE extension (ffdrws)");
    *status = 0xeb;
    return 0xeb;
  }
  if (nrows < 0) {
    *status = 0x132;
    return 0x132;
  }
  if (nrows == 0) {
LAB_00113ed6:
    return *status;
  }
  ffgkyjj(fptr,"NAXIS1",(LONGLONG *)&local_b0,local_88,status);
  ffgkyjj(fptr,"NAXIS2",&local_98,local_88,status);
  sVar6 = local_b0;
  if (nrows != 1) {
    lVar3 = 1;
    do {
      if (rownum[lVar3] <= rownum[lVar3 + -1]) {
        pcVar7 = "row numbers are not in increasing order (ffdrws)";
        goto LAB_00113f19;
      }
      lVar3 = lVar3 + 1;
    } while (nrows != lVar3);
  }
  lVar3 = *rownum;
  if (lVar3 < 1) {
    pcVar7 = "first row to delete is less than 1 (ffdrws)";
  }
  else {
    if (rownum[nrows + -1] <= local_98) {
      local_a0 = local_98;
      local_a8 = malloc(local_b0);
      if (local_a8 == (void *)0x0) {
        ffpmsg("malloc failed (ffdrwsll)");
        *status = 0x71;
        return 0x71;
      }
      bytepos_00 = (lVar3 + -1) * sVar6 + fptr->Fptr->datastart;
      bytepos = sVar6 + bytepos_00;
      lVar3 = lVar3 + 1;
      lVar5 = local_a0;
      local_90 = nrows;
      if (nrows != 1) {
        lVar4 = 1;
        do {
          if (lVar3 < rownum[lVar4]) {
            local_a0 = lVar4;
            ffmbyt(fptr,bytepos,0,status);
            ffgbyt(fptr,local_b0,local_a8,status);
            ffmbyt(fptr,bytepos_00,1,status);
            ffpbyt(fptr,local_b0,local_a8,status);
            if (0 < *status) {
              pcVar7 = "error while copying good rows in table (ffdrws)";
              goto LAB_001140f0;
            }
            bytepos_00 = bytepos_00 + local_b0;
            lVar4 = local_a0;
            sVar6 = local_b0;
          }
          else {
            lVar4 = lVar4 + 1;
          }
          bytepos = bytepos + sVar6;
          lVar3 = lVar3 + 1;
          lVar5 = local_98;
        } while (lVar4 < local_90);
      }
      if (lVar3 <= lVar5) {
        lVar3 = lVar3 + -1;
        do {
          ffmbyt(fptr,bytepos,0,status);
          buffer = local_a8;
          ffgbyt(fptr,local_b0,local_a8,status);
          ffmbyt(fptr,bytepos_00,1,status);
          ffpbyt(fptr,local_b0,buffer,status);
          if (0 < *status) {
            pcVar7 = "failed to copy remaining rows in table (ffdrws)";
LAB_001140f0:
            ffpmsg(pcVar7);
            free(local_a8);
            goto LAB_00113ed6;
          }
          bytepos_00 = bytepos_00 + local_b0;
          bytepos = bytepos + local_b0;
          lVar3 = lVar3 + 1;
          lVar5 = local_98;
        } while (lVar3 < local_98);
      }
      free(local_a8);
      ffdrow(fptr,(lVar5 - local_90) + 1,local_90,status);
      ffcmph(fptr,status);
      goto LAB_00113ed6;
    }
    pcVar7 = "last row to delete exceeds size of table (ffdrws)";
  }
LAB_00113f19:
  ffpmsg(pcVar7);
  *status = 0x133;
  return 0x133;
}

Assistant:

int ffdrwsll(fitsfile *fptr, /* I - FITS file pointer                        */
           LONGLONG *rownum, /* I - list of rows to delete (1 = first)       */
           LONGLONG nrows,  /* I - number of rows to delete                 */
           int *status)     /* IO - error status                            */
/*
 delete the list of rows from the table (1 = first row of table).
*/
{
    LONGLONG insertpos, nextrowpos;
    LONGLONG naxis1, naxis2, ii, nextrow;
    char comm[FLEN_COMMENT];
    unsigned char *buffer;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        ffpmsg("Can only delete rows in TABLE or BINTABLE extension (ffdrws)");
        return(*status = NOT_TABLE);
    }

    if (nrows < 0 )
        return(*status = NEG_BYTES);
    else if (nrows == 0)
        return(*status);   /* no op, so just return */

    ffgkyjj(fptr, "NAXIS1", &naxis1, comm, status); /* row width   */
    ffgkyjj(fptr, "NAXIS2", &naxis2, comm, status); /* number of rows */

    /* check that input row list is in ascending order */
    for (ii = 1; ii < nrows; ii++)
    {
        if (rownum[ii - 1] >= rownum[ii])
        {
            ffpmsg("row numbers are not in increasing order (ffdrws)");
            return(*status = BAD_ROW_NUM);
        }
    }

    if (rownum[0] < 1)
    {
        ffpmsg("first row to delete is less than 1 (ffdrws)");
        return(*status = BAD_ROW_NUM);
    }
    else if (rownum[nrows - 1] > naxis2)
    {
        ffpmsg("last row to delete exceeds size of table (ffdrws)");
        return(*status = BAD_ROW_NUM);
    }

    buffer = (unsigned char *) malloc( (size_t) naxis1);  /* buffer for one row */

    if (!buffer)
    {
        ffpmsg("malloc failed (ffdrwsll)");
        return(*status = MEMORY_ALLOCATION);
    }

    /* byte location to start of first row to delete, and the next row */
    insertpos = (fptr->Fptr)->datastart + ((rownum[0] - 1) * naxis1);
    nextrowpos = insertpos + naxis1;
    nextrow = rownum[0] + 1;

    /* work through the list of rows to delete */
    for (ii = 1; ii < nrows; nextrow++, nextrowpos += naxis1)
    {
        if (nextrow < rownum[ii])  
        {   /* keep this row, so copy it to the new position */

            ffmbyt(fptr, nextrowpos, REPORT_EOF, status);
            ffgbyt(fptr, naxis1, buffer, status);  /* read the bytes */

            ffmbyt(fptr, insertpos, IGNORE_EOF, status);
            ffpbyt(fptr, naxis1, buffer, status);  /* write the bytes */

            if (*status > 0)
            {
                ffpmsg("error while copying good rows in table (ffdrws)");
                free(buffer);
                return(*status);
            }
            insertpos += naxis1;
        }
        else
        {   /* skip over this row since it is in the list */
            ii++;
        }
    }

    /* finished with all the rows to delete; copy remaining rows */
    while(nextrow <= naxis2)
    {
        ffmbyt(fptr, nextrowpos, REPORT_EOF, status);
        ffgbyt(fptr, naxis1, buffer, status);  /* read the bytes */

        ffmbyt(fptr, insertpos, IGNORE_EOF, status);
        ffpbyt(fptr, naxis1, buffer, status);  /* write the bytes */

        if (*status > 0)
        {
            ffpmsg("failed to copy remaining rows in table (ffdrws)");
            free(buffer);
            return(*status);
        }
        insertpos  += naxis1;
        nextrowpos += naxis1;
        nextrow++; 
    }
    free(buffer);
    
    /* now delete the empty rows at the end of the table */
    ffdrow(fptr, naxis2 - nrows + 1, nrows, status);

    /* Update the heap data, if any.  This will remove any orphaned data */
    /* that was only pointed to by the rows that have been deleted */
    ffcmph(fptr, status);
    
    return(*status);
}